

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m6502.h
# Opt level: O0

uint8_t __thiscall m6502::LSR(m6502 *this)

{
  code *pcVar1;
  byte bVar2;
  const_reference pvVar3;
  uint16_t tmp;
  m6502 *this_local;
  
  fetch(this);
  SetFlag(this,C,(bool)(this->fetched & 1));
  bVar2 = this->fetched >> 1;
  SetFlag(this,Z,bVar2 == 0);
  SetFlag(this,N,false);
  pvVar3 = std::vector<m6502::INSTRUCTION,_std::allocator<m6502::INSTRUCTION>_>::operator[]
                     (&this->lookup,(ulong)this->opcode);
  pcVar1 = (code *)pvVar3->addrmode;
  if (pcVar1 == IMP && (pcVar1 == (code *)0x0 || *(long *)&pvVar3->field_0x38 == 0)) {
    this->a = bVar2;
  }
  else {
    write(this,(uint)this->addrAbs,(void *)(ulong)bVar2,
          CONCAT62((int6)((ulong)pcVar1 >> 0x10),this->addrAbs));
  }
  return '\0';
}

Assistant:

uint8_t LSR()
  {
    fetch();
    SetFlag(C, fetched & 0x0001u);
    uint16_t tmp = fetched >> 1;
    SetFlag(Z, (tmp & 0x00FFu) == 0);
    SetFlag(N, tmp & 0x80u);
    if (lookup[opcode].addrmode == &m6502::IMP)
    {
      a = tmp & 0x00FFu;
    }
    else
    {
      write(addrAbs, tmp & 0x00FFu);
    }
    return 0;
  }